

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repl.h
# Opt level: O1

void __thiscall repl::repl(repl *this)

{
  anon_class_1_0_00000001_for_m_object *in_RCX;
  long *local_b0 [2];
  long local_a0 [2];
  undefined1 local_90 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  handler_id_type local_60;
  handler_id_type local_38;
  
  this->m_active = true;
  this->m_step = 0;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"help","");
  handlebars::
  dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::connect<repl::repl()::_lambda(auto:1)_1_>
            (&local_38,
             (dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
             (anon_class_1_0_00000001_for_m_object *)in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.signal._M_dataplus._M_p != &local_38.signal.field_2) {
    operator_delete(local_38.signal._M_dataplus._M_p,
                    local_38.signal.field_2._M_allocated_capacity + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"quit","");
  local_90._0_8_ = this;
  handlebars::
  dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::connect<repl::repl()::_lambda(auto:1)_2_>
            (&local_60,
             (dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
             (anon_class_8_1_8991fb9c_for_m_object *)in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.signal._M_dataplus._M_p != &local_60.signal.field_2) {
    operator_delete(local_60.signal._M_dataplus._M_p,
                    local_60.signal.field_2._M_allocated_capacity + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"echo","");
  handlebars::
  dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::connect<repl::repl()::_lambda(auto:1)_3_>
            ((handler_id_type *)(local_90 + 8),
             (dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._8_8_ != &local_78) {
    operator_delete((void *)local_90._8_8_,local_78._0_8_ + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  return;
}

Assistant:

repl()
    : m_step(0)
    , m_active(true)
  {
    events::connect("help", [](auto argv) { 
		std::cout << "valid commands: help quit echo\n";
	});
    events::connect("quit", [this](auto argv) { this->m_active = false; });
    events::connect("echo", [](auto argv) {
      for (auto t = argv.begin() + 1; t != argv.end(); ++t) {
        std::cout << *t << '\n';
      }
    });
  }